

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusTexFilter::is_valid_val(MthdCelsiusTexFilter *this)

{
  MthdCelsiusTexFilter *this_local;
  
  if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x35 == 0) {
    if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c == 0) ||
       (6 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c)) {
      this_local._7_1_ = false;
    }
    else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3c == 0) ||
            (2 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3c)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 13, 11))
			return false;
		if (extr(val, 24, 4) < 1 || extr(val, 24, 4) > 6)
			return false;
		if (extr(val, 28, 4) < 1 || extr(val, 28, 4) > 2)
			return false;
		return true;
	}